

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.cpp
# Opt level: O0

int __thiscall crypto::arc4::init(arc4 *this,EVP_PKEY_CTX *ctx)

{
  arc4 *paVar1;
  ulong in_RDX;
  size_t i_1;
  size_t j;
  size_t i;
  arc4 *local_30;
  ulong local_28;
  arc4 *local_20;
  
  this->b = 0;
  this->a = 0;
  local_20 = (arc4 *)0x0;
  paVar1 = this;
  while (local_20 < (arc4 *)0x100) {
    local_20->state[(long)this->state] = (uint8_t)local_20;
    paVar1 = (arc4 *)(local_20->state + 1);
    local_20 = paVar1;
  }
  local_28 = 0;
  local_30 = (arc4 *)0x0;
  while (local_30 < (arc4 *)0x100) {
    local_28 = local_28 + local_30->state[(long)this->state] +
               (ulong)(byte)ctx[(ulong)local_30 % in_RDX] & 0xff;
    std::swap<unsigned_char>(local_30->state + (long)this->state,this->state + local_28);
    paVar1 = (arc4 *)(local_30->state + 1);
    local_30 = paVar1;
  }
  return (int)paVar1;
}

Assistant:

void arc4::init(const char * key, size_t length) {
	
	a = b = 0;
	
	for(size_t i = 0; i < sizeof(state); i++){
		state[i] = boost::uint8_t(i);
	}
	
	size_t j = 0;
	for(size_t i = 0; i < sizeof(state); i++) {
		j = (j + state[i] + boost::uint8_t(key[i % length])) % sizeof(state);
		std::swap(state[i], state[j]);
	}
	
}